

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_module.cpp
# Opt level: O0

void __thiscall
sc_core::sc_module_dynalloc_list::~sc_module_dynalloc_list(sc_module_dynalloc_list *this)

{
  bool bVar1;
  sc_module *psVar2;
  iterator it;
  sc_plist<sc_core::sc_module_*> *in_stack_ffffffffffffffb8;
  sc_plist_iter<sc_core::sc_module_*> *in_stack_ffffffffffffffc0;
  sc_plist_base_iter local_18;
  
  sc_plist_iter<sc_core::sc_module_*>::sc_plist_iter
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,false);
  while( true ) {
    bVar1 = sc_plist_base_iter::empty(&local_18);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    psVar2 = sc_plist_iter<sc_core::sc_module_*>::operator*
                       ((sc_plist_iter<sc_core::sc_module_*> *)0x2acccc);
    (psVar2->super_sc_object).m_parent = (sc_object *)0x0;
    psVar2 = sc_plist_iter<sc_core::sc_module_*>::operator*
                       ((sc_plist_iter<sc_core::sc_module_*> *)0x2accea);
    if (psVar2 != (sc_module *)0x0) {
      (*(psVar2->super_sc_object)._vptr_sc_object[7])();
    }
    sc_plist_base_iter::operator++(&local_18,0);
  }
  sc_plist_iter<sc_core::sc_module_*>::~sc_plist_iter
            ((sc_plist_iter<sc_core::sc_module_*> *)0x2acd4f);
  sc_plist<sc_core::sc_module_*>::~sc_plist((sc_plist<sc_core::sc_module_*> *)0x2acd5b);
  return;
}

Assistant:

sc_module_dynalloc_list::~sc_module_dynalloc_list()
{
    sc_plist<sc_module*>::iterator it( m_list );
    while( ! it.empty() ) {
        (*it)->m_parent = 0;
        delete *it;
        it ++;
    }
}